

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O0

bool MeCab::Viterbi::buildBestLattice(Lattice *lattice)

{
  long *plVar1;
  long *in_RDI;
  Node *prev_node;
  Node *node;
  long *local_10;
  
  local_10 = (long *)(**(code **)(*in_RDI + 0x18))();
  while (*local_10 != 0) {
    *(undefined1 *)(local_10 + 10) = 1;
    plVar1 = (long *)*local_10;
    plVar1[1] = (long)local_10;
    local_10 = plVar1;
  }
  return true;
}

Assistant:

bool Viterbi::buildBestLattice(Lattice *lattice) {
  Node *node = lattice->eos_node();
  for (Node *prev_node; node->prev;) {
    node->isbest = 1;
    prev_node = node->prev;
    prev_node->next = node;
    node = prev_node;
  }

  return true;
}